

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O0

void __thiscall Optimizer::~Optimizer(Optimizer *this)

{
  code *pcVar1;
  Optimizer *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Optimizer() {}